

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O2

void setlock(int argc,char **argv)

{
  char **ppcVar1;
  char *f;
  int iVar2;
  uint x;
  uint d;
  
  d = 0;
  do {
    x = 0;
    while( true ) {
      while( true ) {
        iVar2 = sgetoptmine(argc,argv,"nNxX");
        if (iVar2 == subgetoptdone) {
          ppcVar1 = argv + subgetoptind;
          f = *ppcVar1;
          if (f == (char *)0x0) {
            setlock_usage();
          }
          if (ppcVar1[1] == (char *)0x0) {
            setlock_usage();
          }
          slock(f,d,x);
          pathexec(ppcVar1 + 1);
          if (x == 0) {
            fatal2("unable to run",ppcVar1[1]);
          }
          _exit(0);
        }
        if (iVar2 != 0x78) break;
        x = 1;
      }
      if (iVar2 == 0x58) break;
      if (iVar2 == 0x6e) {
        d = 1;
      }
      else if (iVar2 == 0x4e) {
        d = 0;
      }
      else {
        setlock_usage();
      }
    }
  } while( true );
}

Assistant:

void setlock(int argc, const char *const *argv) {
  int opt;
  unsigned int delay =0;
  unsigned int x =0;
  const char *fn;

  while ((opt =getopt(argc, argv, "nNxX")) != opteof)
    switch(opt) {
      case 'n': delay =1; break;
      case 'N': delay =0; break;
      case 'x': x =1; break;
      case 'X': x =0; break;
      default: setlock_usage();
    }
  argv +=optind;
  if (! (fn =*argv)) setlock_usage();
  if (! *++argv) setlock_usage();

  slock(fn, delay, x);
  pathexec(argv);
  if (! x) fatal2("unable to run", *argv);
  _exit(0);
}